

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_move_up_and_sol(Fl_Input *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int i;
  
  iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  iVar3 = (this->super_Fl_Input_).position_;
  i = iVar2 + -1;
  if (iVar3 < 1) {
    i = iVar3;
  }
  if (iVar2 != iVar3) {
    i = iVar3;
  }
  iVar3 = Fl_Input_::line_start(&this->super_Fl_Input_,i);
  iVar3 = shift_position(this,iVar3);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  return (uint)!bVar1 + iVar3;
}

Assistant:

int Fl_Input::kf_move_up_and_sol() {
  if (line_start(position())==position() && position()>0)
    return shift_position(line_start(position()-1)) + NORMAL_INPUT_MOVE;
  else
    return shift_position(line_start(position())) + NORMAL_INPUT_MOVE;
}